

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Ray *ray)

{
  ostream *poVar1;
  void *pvVar2;
  Ray *ray_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Ray {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"start: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ray->start).field_0.field_0.x);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(ray->start).field_0.field_0.y);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(ray->start).field_0.field_0.z);
  poVar1 = std::operator<<(poVar1," direction: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ray->direction).field_0.field_0.x);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(ray->direction).field_0.field_0.y);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,(ray->direction).field_0.field_0.z);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Ray &ray) {
    os << "Ray {"<<std::endl<<"start: " << ray.start.x <<" "<< ray.start.y << ray.start.z << " direction: " <<  ray.direction.x <<" "<< ray.direction.y << ray.direction.z<<std::endl<<"}"<<std::endl;
    return os;
}